

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<long_long,_QList<QString>_>_>::findBucketWithHash<long_long>
          (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *this,longlong *key,size_t hash)

{
  Span *pSVar1;
  bool bVar2;
  Span *pSVar3;
  Span *pSVar4;
  ulong uVar5;
  Bucket BVar6;
  
  pSVar1 = this->spans;
  uVar5 = this->numBuckets - 1 & hash;
  pSVar3 = pSVar1 + (uVar5 >> 7);
  uVar5 = (ulong)((uint)uVar5 & 0x7f);
  do {
    if ((pSVar3->offsets[uVar5] == 0xff) ||
       (*(long *)pSVar3->entries[pSVar3->offsets[uVar5]].storage.data == *key)) {
      bVar2 = false;
    }
    else {
      uVar5 = uVar5 + 1;
      bVar2 = true;
      if (uVar5 == 0x80) {
        pSVar4 = pSVar3 + 1;
        pSVar3 = pSVar1;
        if (((long)pSVar4 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) != 0)
        {
          pSVar3 = pSVar4;
        }
        uVar5 = 0;
      }
    }
  } while (bVar2);
  BVar6.index = uVar5;
  BVar6.span = pSVar3;
  return BVar6;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }